

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O3

ze_result_t
tracing_layer::zeCommandListGetDeviceHandle
          (ze_command_list_handle_t hCommandList,ze_device_handle_t *phDevice)

{
  ulong uVar1;
  _func_void__ze_command_list_get_device_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var2;
  _func__ze_result_t__ze_command_list_handle_t_ptr__ze_device_handle_t_ptr_ptr *zeApiPtr;
  _ze_result_t _Var3;
  ze_result_t zVar4;
  char *pcVar5;
  ulong *puVar6;
  long lVar7;
  _ze_device_handle_t **in_RSI;
  _ze_command_list_handle_t *in_RDI;
  ulong uVar8;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_command_list_get_device_handle_params_t tracerParams;
  ze_device_handle_t *local_d8;
  ze_command_list_handle_t local_d0;
  _func_void__ze_command_list_get_device_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_c8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_c0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_78;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_60;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_50;
  _ze_command_list_get_device_handle_params_t local_40;
  
  if (DAT_00183428 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr__ze_device_handle_t_ptr_ptr *)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    tracing_layer::tracingInProgress::__tls_init();
    pcVar5 = (char *)__tls_get_addr(&PTR_00182fa0);
    if (*pcVar5 != '\0') {
      _Var3 = (*DAT_00183428)(in_RDI,in_RSI);
      return _Var3;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar5 = '\x01';
    local_40.phCommandList = &local_d0;
    local_40.pphDevice = &local_d8;
    local_a8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_c0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_c0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_c8 = (_func_void__ze_command_list_get_device_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_c0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar6 != (ulong *)0x0) && (*puVar6 != 0)) {
      lVar7 = 0xcb0;
      uVar8 = 0;
      do {
        uVar1 = puVar6[1];
        local_50.current_api_callback =
             *(_func_void__ze_command_list_get_device_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0x990) + lVar7);
        p_Var2 = *(_func_void__ze_command_list_get_device_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x338) + lVar7);
        local_50.pUserData = *(void **)(uVar1 + lVar7);
        if (vStack_c0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_c0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_c0,
                     (iterator)
                     vStack_c0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          (vStack_c0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_50.current_api_callback;
          (vStack_c0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_50.pUserData;
          vStack_c0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_c0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_60.pUserData = *(void **)(puVar6[1] + lVar7);
        local_60.current_api_callback = p_Var2;
        if (local_a8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_a8,
                     (iterator)
                     local_a8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_60);
        }
        else {
          (local_a8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var2;
          (local_a8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_60.pUserData;
          local_a8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_a8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xcb8;
      } while (uVar8 < *puVar6);
    }
    p_Var2 = local_c8;
    zeApiPtr = DAT_00183428;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_78,&vStack_c0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_90,&local_a8);
    zVar4 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,_ze_device_handle_t**),_ze_command_list_get_device_handle_params_t*,void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_get_device_handle_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,_ze_device_handle_t**&>
                      (zeApiPtr,&local_40,p_Var2,&local_78,&local_90,&local_d0,&local_d8);
    if (local_90.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_c0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_c0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_c0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_c0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_get_device_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetDeviceHandle(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_device_handle_t* phDevice                    ///< [out] handle of the device on which the command list was created
        )
    {
        auto pfnGetDeviceHandle = context.zeDdiTable.CommandList.pfnGetDeviceHandle;

        if( nullptr == pfnGetDeviceHandle)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnGetDeviceHandle, hCommandList, phDevice);

        // capture parameters
        ze_command_list_get_device_handle_params_t tracerParams = {
            &hCommandList,
            &phDevice
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListGetDeviceHandleCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListGetDeviceHandleCb_t, CommandList, pfnGetDeviceHandleCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnGetDeviceHandle,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.pphDevice);
    }